

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

void __thiscall Potassco::TheoryData::resizeAtoms(TheoryData *this,uint32_t newSize)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t in_ESI;
  undefined8 *in_RDI;
  TheoryAtom **in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  uVar1 = numAtoms((TheoryData *)0x1422c4);
  if (in_ESI != uVar1) {
    uVar1 = in_ESI;
    uVar2 = numAtoms((TheoryData *)0x1422e0);
    if (uVar2 < uVar1) {
      do {
        Data::RawStack<Potassco::TheoryAtom_*>::push
                  ((RawStack<Potassco::TheoryAtom_*> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        uVar2 = numAtoms((TheoryData *)0x142311);
      } while (uVar2 != in_ESI);
    }
    else {
      do {
        Data::RawStack<Potassco::TheoryAtom_*>::pop((RawStack<Potassco::TheoryAtom_*> *)*in_RDI);
        uVar1 = numAtoms((TheoryData *)0x142332);
      } while (uVar1 != in_ESI);
    }
  }
  return;
}

Assistant:

void TheoryData::resizeAtoms(uint32_t newSize) {
	if (newSize != numAtoms()) {
		if (newSize > numAtoms()) { do { data_->atoms.push(); } while (numAtoms() != newSize); }
		else                      { do { data_->atoms.pop();  } while (numAtoms() != newSize); }
	}
}